

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfile_test.cpp
# Opt level: O1

pint p_test_case_pfile_general_test(void)

{
  int iVar1;
  FILE *__s;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  iVar1 = p_file_remove(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
           ,0x27);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_file_is_exists("./pfile_test_file.txt");
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
           ,0x29);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_file_remove("./ pfile_test_file_remove.txt",0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
           ,0x2a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  __s = fopen("./pfile_test_file.txt","w");
  if (__s != (FILE *)0x0) {
    iVar1 = p_file_is_exists("./pfile_test_file.txt");
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
             ,0x2e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    fwrite("This is a test file string\n",0x1b,1,__s);
    iVar1 = fclose(__s);
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
             ,0x32);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar1 = p_file_remove("./pfile_test_file.txt",0);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
             ,0x33);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_libsys_shutdown();
    return -(uint)(p_test_module_fail_counter != 0);
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/pfile_test.cpp"
         ,0x2d);
  exit(-1);
}

Assistant:

P_TEST_CASE_BEGIN (pfile_general_test)
{
	p_libsys_init ();

	P_TEST_CHECK (p_file_remove (NULL, NULL) == FALSE);

	P_TEST_CHECK (p_file_is_exists (PFILE_TEST_FILE) == FALSE);
	P_TEST_CHECK (p_file_remove ("." P_DIR_SEPARATOR" pfile_test_file_remove.txt", NULL) == FALSE);

	FILE *file = fopen (PFILE_TEST_FILE, "w");
	P_TEST_REQUIRE (file != NULL);
	P_TEST_CHECK (p_file_is_exists (PFILE_TEST_FILE) == TRUE);

	fprintf (file, "This is a test file string\n");

	P_TEST_CHECK (fclose (file) == 0);
	P_TEST_CHECK (p_file_remove (PFILE_TEST_FILE, NULL) == TRUE);

	p_libsys_shutdown ();
}